

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * __thiscall flatbuffers::String::str_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  String SVar1;
  
  SVar1 = *this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this + 1,
             &this[1].super_Vector<char,_unsigned_int> + (uint)SVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const { return std::string(c_str(), size()); }